

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::isLegalFormatForTarget(GLenum target,GLenum format)

{
  bool bVar1;
  TextureFormat local_1c;
  TextureFormat fmt;
  GLenum format_local;
  GLenum target_local;
  
  fmt.order = format;
  fmt.type = target;
  local_1c = glu::mapGLInternalFormat(format);
  if ((fmt.type == 0x806f) && (bVar1 = isDepthFormat(&local_1c), bVar1)) {
    format_local._3_1_ = false;
  }
  else if (((fmt.type != 0x9100) && (fmt.type != 0x9102)) ||
          (bVar1 = isRenderableFormat(fmt.order), bVar1)) {
    if ((fmt.type == 0x8c2a) || (bVar1 = isTextureBufferFormat(fmt.order), !bVar1)) {
      format_local._3_1_ = false;
    }
    else {
      format_local._3_1_ = true;
    }
  }
  else {
    format_local._3_1_ = false;
  }
  return format_local._3_1_;
}

Assistant:

static bool isLegalFormatForTarget (glw::GLenum target, glw::GLenum format)
{
	const tcu::TextureFormat fmt = glu::mapGLInternalFormat(format);

	if (target == GL_TEXTURE_3D && isDepthFormat(fmt))
		return false;
	if ((target == GL_TEXTURE_2D_MULTISAMPLE || target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY) && !isRenderableFormat(format))
		return false;
	if (target == GL_TEXTURE_BUFFER || !isTextureBufferFormat(format))
		return false;
	return true;
}